

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_> __thiscall
wasm_externtype_t::New
          (wasm_externtype_t *this,
          unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *ptr)

{
  ExternType *base;
  _func_int **in_RAX;
  _func_int **local_18;
  
  base = (ptr->_M_t).
         super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
         ._M_t.
         super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
         .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_18 = in_RAX;
  switch(base->kind) {
  case First:
    wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(base);
    std::make_unique<wasm_functype_t,wabt::interp::FuncType&>((FuncType *)&stack0xffffffffffffffe8);
    break;
  case Table:
    wabt::cast<wabt::interp::TableType,wabt::interp::ExternType>(base);
    std::make_unique<wasm_tabletype_t,wabt::interp::TableType&>
              ((TableType *)&stack0xffffffffffffffe8);
    break;
  case Memory:
    wabt::cast<wabt::interp::MemoryType,wabt::interp::ExternType>(base);
    std::make_unique<wasm_memorytype_t,wabt::interp::MemoryType&>
              ((MemoryType *)&stack0xffffffffffffffe8);
    break;
  case Global:
    wabt::cast<wabt::interp::GlobalType,wabt::interp::ExternType>(base);
    std::make_unique<wasm_globaltype_t,wabt::interp::GlobalType&>
              ((GlobalType *)&stack0xffffffffffffffe8);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0xc5,
                  "static std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(std::unique_ptr<ExternType>)"
                 );
  }
  this->_vptr_wasm_externtype_t = local_18;
  return (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(
    std::unique_ptr<ExternType> ptr) {
  switch (ptr->kind) {
    case ExternKind::Func:
      return std::make_unique<wasm_functype_t>(*cast<FuncType>(ptr.get()));

    case ExternKind::Table:
      return std::make_unique<wasm_tabletype_t>(*cast<TableType>(ptr.get()));

    case ExternKind::Memory:
      return std::make_unique<wasm_memorytype_t>(*cast<MemoryType>(ptr.get()));

    case ExternKind::Global:
      return std::make_unique<wasm_globaltype_t>(*cast<GlobalType>(ptr.get()));

    case ExternKind::Tag:
      break;
  }

  assert(false);
  return {};
}